

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

RepeatedFieldType *
google::protobuf::internal::RepeatedStringTypeTraits::GetDefaultRepeatedField_abi_cxx11_(void)

{
  int iVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  
  if (GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_);
    if (iVar1 != 0) {
      p = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)operator_new(0x18);
      (p->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ = (void *)0x0;
      (p->super_RepeatedPtrFieldBase).current_size_ = 0;
      (p->super_RepeatedPtrFieldBase).capacity_proxy_ = 0;
      (p->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_ =
           OnShutdownDelete<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(p);
      __cxa_guard_release(&GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_);
    }
  }
  return GetDefaultRepeatedField[abi:cxx11]()::instance_abi_cxx11_;
}

Assistant:

const RepeatedStringTypeTraits::RepeatedFieldType*
RepeatedStringTypeTraits::GetDefaultRepeatedField() {
  static auto instance = OnShutdownDelete(new RepeatedFieldType);
  return instance;
}